

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O3

void __thiscall Table::printState(Table *this)

{
  char cVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 uStack_38;
  
  lVar5 = 0;
  uStack_38 = in_RAX;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    lVar5 = lVar5 + 3;
    lVar4 = 0;
    do {
      cVar1 = Cell::getNumber(this->table[0] + lVar4);
      uStack_38 = CONCAT17(cVar1,(undefined7)uStack_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    this = (Table *)(this->table + 1);
  } while (lVar5 != 9);
  iVar3 = 6;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void Table::printState() {
    for (auto & i : table) {
        std::cout << "|";
        for (auto & j : i) {
            std::cout << j.getNumber() << "|";
        }
        std::cout << std::endl;
    }
    for (int i = 0; i < 2*HEIGHT; i++) {
        std::cout << "-";
    }
    std::cout << std::endl;
}